

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

void bddFixTree(DdManager *table,MtrNode *treenode)

{
  MtrHalfWord local_1c;
  MtrNode *treenode_local;
  DdManager *table_local;
  
  if (treenode != (MtrNode *)0x0) {
    if ((int)treenode->index < table->size) {
      local_1c = table->perm[treenode->index];
    }
    else {
      local_1c = treenode->index;
    }
    treenode->low = local_1c;
    if (treenode->child != (MtrNode *)0x0) {
      bddFixTree(table,treenode->child);
    }
    if (treenode->younger != (MtrNode *)0x0) {
      bddFixTree(table,treenode->younger);
    }
    if ((treenode->parent != (MtrNode *)0x0) && (treenode->low < treenode->parent->low)) {
      treenode->parent->low = treenode->low;
      treenode->parent->index = treenode->index;
    }
  }
  return;
}

Assistant:

static void
bddFixTree(
  DdManager * table,
  MtrNode * treenode)
{
    if (treenode == NULL) return;
    treenode->low = ((int) treenode->index < table->size) ?
        table->perm[treenode->index] : treenode->index;
    if (treenode->child != NULL) {
        bddFixTree(table, treenode->child);
    }
    if (treenode->younger != NULL)
        bddFixTree(table, treenode->younger);
    if (treenode->parent != NULL && treenode->low < treenode->parent->low) {
        treenode->parent->low = treenode->low;
        treenode->parent->index = treenode->index;
    }
    return;

}